

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Foreign>::RefPtr
          (RefPtr<wabt::interp::Foreign> *this,Store *store,Ref ref)

{
  ObjectKind OVar1;
  Object *pOVar2;
  Index IVar3;
  Foreign *pFVar4;
  Ref ref_00;
  RefPtr<wabt::interp::Foreign> *pRVar5;
  Store *extraout_RDX;
  RefPtr<wabt::interp::Foreign> *this_00;
  Foreign *pFStack_50;
  size_t sStack_48;
  
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar2 & 1) == 0) {
    OVar1 = pOVar2->kind_;
    if (OVar1 != Foreign) {
      pRVar5 = (RefPtr<wabt::interp::Foreign> *)0x0;
      this_00 = (RefPtr<wabt::interp::Foreign> *)(ulong)OVar1;
      if (ref.index == 0) {
        this_00 = pRVar5;
      }
      interp::RefPtr((interp *)this_00);
      sStack_48 = ref.index;
      pFVar4 = (Foreign *)operator_new(0x48);
      Foreign::Foreign(pFVar4,extraout_RDX,pRVar5->obj_);
      pFStack_50 = pFVar4;
      ref_00.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Foreign*>
                               ((FreeList<wabt::interp::Object*> *)&store->objects_,&pFStack_50);
      RefPtr(this_00,store,ref_00);
      (this_00->obj_->super_Object).self_.index = ref_00.index;
      return;
    }
    IVar3 = Store::NewRoot(store,ref);
    this->root_index_ = IVar3;
    pFVar4 = (Foreign *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pFVar4 & 1) == 0) {
      this->obj_ = pFVar4;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}